

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_node.hpp
# Opt level: O0

void __thiscall
ranger::bhvr_tree::
sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
::exec(sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
       *this,agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
             *ap,handler_type *hdl)

{
  abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
  *node;
  function<void_(bool,_test_agent_*)> local_40;
  handler_type *local_20;
  handler_type *hdl_local;
  agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
  *ap_local;
  sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
  *this_local;
  
  local_20 = hdl;
  hdl_local = (handler_type *)ap;
  ap_local = (agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
              *)this;
  node = abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
         ::get_first_child(&this->
                            super_abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                          );
  std::function<void_(bool,_test_agent_*)>::function(&local_40,hdl);
  exec_impl(this,ap,node,&local_40);
  std::function<void_(bool,_test_agent_*)>::~function(&local_40);
  return;
}

Assistant:

void exec(AgentProxy& ap, typename AgentProxy::handler_type hdl) const final {
    exec_impl(ap, this->get_first_child(), std::move(hdl));
  }